

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void drawImage5(Array2D<Imf_3_4::Rgba> *px,int w,int h,int xMin,int xMax,int yMin,int yMax,
               int xLevel,int yLevel)

{
  int ySamples;
  int xSamples;
  
  xSamples = 1 << ((byte)xLevel & 0x1f);
  ySamples = 1 << ((byte)yLevel & 0x1f);
  anon_unknown.dwarf_1092::mndl<Imf_3_4::Rgba>
            (px,w,h,xMin,xMax,yMin,yMax,xSamples,ySamples,0.2839,0.2852,0.00961,
             (double)ySamples / (double)xSamples,0.25,0.31);
  return;
}

Assistant:

void
drawImage5 (
    Array2D<Rgba>& px,
    int            w,
    int            h,
    int            xMin,
    int            xMax,
    int            yMin,
    int            yMax,
    int            xLevel,
    int            yLevel)
{
    mndl (
        px,
        w,
        h,
        xMin,
        xMax,
        yMin,
        yMax,
        (1 << xLevel),
        (1 << yLevel),
        0.2839,
        0.2852,
        0.00961,
        double (1 << yLevel) / double (1 << xLevel),
        0.25,
        0.31);
}